

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::texcoord2h> *value)

{
  bool bVar1;
  texcoord2h local_26;
  texcoord2h v;
  optional<tinyusdz::value::texcoord2h> *poStack_20;
  optional<tinyusdz::value::texcoord2h> *value_local;
  AsciiParser *this_local;
  
  poStack_20 = value;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::operator=(poStack_20);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,&local_26);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::operator=(poStack_20,&local_26);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::texcoord2h> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::texcoord2h v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}